

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O2

Result __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store>::canOptimizeConstant
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *this,Literal *literal)

{
  ulong uVar1;
  undefined8 uVar2;
  Address AVar3;
  Result RVar4;
  
  uVar1 = Literal::getInteger(literal);
  if (uVar1 < 0x400) {
    AVar3.addr = uVar1 + (this->curr->offset).addr;
    uVar2 = CONCAT71((int7)((ulong)this->curr >> 8),1);
    if (AVar3.addr < 0x400) goto LAB_00ac3cab;
  }
  uVar2 = 0;
  AVar3.addr = 0;
LAB_00ac3cab:
  RVar4.total.addr = AVar3.addr;
  RVar4._0_8_ = uVar2;
  return RVar4;
}

Assistant:

Result canOptimizeConstant(Literal literal) {
    uint64_t value = literal.getInteger();
    // Avoid uninteresting corner cases with peculiar offsets.
    if (value < PassOptions::LowMemoryBound) {
      // The total offset must not allow reaching reasonable memory
      // by overflowing.
      auto total = curr->offset + value;
      if (total < PassOptions::LowMemoryBound) {
        return Result(total);
      }
    }
    return Result();
  }